

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_CreateDescriptor_sh_wsh_sortedmulti_Test::TestBody
          (Descriptor_CreateDescriptor_sh_wsh_sortedmulti_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  AssertHelper local_9b8;
  Message local_9b0;
  undefined1 local_9a8 [8];
  AssertionResult gtest_ar;
  Message local_990;
  string local_988;
  AssertHelper local_968;
  Message local_960 [2];
  Descriptor local_950;
  allocator local_7e1;
  string local_7e0 [8];
  string desc_str;
  Descriptor desc;
  string local_650;
  allocator local_629;
  string local_628;
  DescriptorKeyInfo local_608;
  allocator local_461;
  string local_460;
  allocator local_439;
  string local_438;
  DescriptorKeyInfo local_418;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  DescriptorKeyInfo local_228;
  undefined1 local_88 [8];
  vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> key_list;
  value_type local_68;
  value_type local_64;
  undefined1 local_60 [8];
  vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
  type_list;
  allocator local_31;
  string local_30 [8];
  string ext_descriptor;
  Descriptor_CreateDescriptor_sh_wsh_sortedmulti_Test *this_local;
  
  ext_descriptor.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "sh(wsh(sortedmulti(2,xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/*,xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*,[1422fcb3/0\'/0\'/68\']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995)))"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>::
  vector((vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
          *)local_60);
  local_64 = kDescriptorScriptSh;
  std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>::
  push_back((vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
             *)local_60,&stack0xffffffffffffff9c);
  local_68 = kDescriptorScriptWsh;
  std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>::
  push_back((vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
             *)local_60,&stack0xffffffffffffff98);
  key_list.
  super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 8;
  std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>::
  push_back((vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
             *)local_60,
            (value_type *)
            ((long)&key_list.
                    super__Vector_base<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>::vector
            ((vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> *)
             local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_248,
             "xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/*"
             ,&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"",&local_271);
  cfd::core::DescriptorKeyInfo::DescriptorKeyInfo(&local_228,&local_248,&local_270);
  std::vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>::
  emplace_back<cfd::core::DescriptorKeyInfo>
            ((vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> *)
             local_88,&local_228);
  cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&local_228);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_438,
             "xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*"
             ,&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_460,"",&local_461);
  cfd::core::DescriptorKeyInfo::DescriptorKeyInfo(&local_418,&local_438,&local_460);
  std::vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>::
  emplace_back<cfd::core::DescriptorKeyInfo>
            ((vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> *)
             local_88,&local_418);
  cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&local_418);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_628,
             "02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995",&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_650,"[1422fcb3/0\'/0\'/68\']",
             (allocator *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 0xf));
  cfd::core::DescriptorKeyInfo::DescriptorKeyInfo(&local_608,&local_628,&local_650);
  std::vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>::
  emplace_back<cfd::core::DescriptorKeyInfo>
            ((vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> *)
             local_88,&local_608);
  cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(&local_608);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator
            ((allocator<char> *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  cfd::core::Descriptor::Descriptor((Descriptor *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e0,"",&local_7e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::CreateDescriptor
                (&local_950,
                 (vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
                  *)local_60,
                 (vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>
                  *)local_88,2,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)0x0);
      cfd::core::Descriptor::operator=((Descriptor *)((long)&desc_str.field_2 + 8),&local_950);
      cfd::core::Descriptor::~Descriptor(&local_950);
    }
  }
  else {
    testing::Message::Message(local_960);
    testing::internal::AssertHelper::AssertHelper
              (&local_968,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3f0,
               "Expected: desc = Descriptor::CreateDescriptor(type_list, key_list, 2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_968,local_960);
    testing::internal::AssertHelper::~AssertHelper(&local_968);
    testing::Message::~Message(local_960);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_988,(Descriptor *)((long)&desc_str.field_2 + 8),false);
      std::__cxx11::string::operator=(local_7e0,(string *)&local_988);
      std::__cxx11::string::~string((string *)&local_988);
    }
  }
  else {
    testing::Message::Message(&local_990);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3f1,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_990);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_990);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_9a8,"desc_str.c_str()","ext_descriptor.c_str()",pcVar2,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a8);
  if (!bVar1) {
    testing::Message::Message(&local_9b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_9b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x3f2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9b8,&local_9b0);
    testing::internal::AssertHelper::~AssertHelper(&local_9b8);
    testing::Message::~Message(&local_9b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a8);
  std::__cxx11::string::~string(local_7e0);
  cfd::core::Descriptor::~Descriptor((Descriptor *)((long)&desc_str.field_2 + 8));
  std::vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_>::~vector
            ((vector<cfd::core::DescriptorKeyInfo,_std::allocator<cfd::core::DescriptorKeyInfo>_> *)
             local_88);
  std::vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>::
  ~vector((vector<cfd::core::DescriptorScriptType,_std::allocator<cfd::core::DescriptorScriptType>_>
           *)local_60);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Descriptor, CreateDescriptor_sh_wsh_sortedmulti) {
  std::string ext_descriptor = "sh(wsh(sortedmulti(2,xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/*,xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*,[1422fcb3/0'/0'/68']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995)))";

  std::vector<DescriptorScriptType> type_list;
  type_list.push_back(DescriptorScriptType::kDescriptorScriptSh);
  type_list.push_back(DescriptorScriptType::kDescriptorScriptWsh);
  type_list.push_back(DescriptorScriptType::kDescriptorScriptSortedMulti);
  std::vector<DescriptorKeyInfo> key_list;
  key_list.emplace_back(DescriptorKeyInfo("xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/*"));
  key_list.emplace_back(DescriptorKeyInfo("xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*"));
  key_list.emplace_back(DescriptorKeyInfo("02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995", "[1422fcb3/0'/0'/68']"));

  Descriptor desc;
  std::string desc_str = "";
  EXPECT_NO_THROW(desc = Descriptor::CreateDescriptor(type_list, key_list, 2));
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_STREQ(desc_str.c_str(), ext_descriptor.c_str());
}